

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O2

int adh_compress_file(char *input_file_name,char *output_file_name)

{
  int iVar1;
  size_t sVar2;
  int i;
  size_t sVar3;
  FILE *output_file_ptr;
  FILE *input_file_ptr;
  byte_t input_buffer [1024];
  byte_t output_buffer [1024];
  
  log_info("adh_compress_file","%-40s %s\n",input_file_name,output_file_name);
  iVar1 = adh_init(input_file_name,output_file_name,&output_file_ptr,&input_file_ptr);
  if (iVar1 == 0) {
    memset(output_buffer,0,0x400);
    memset(input_buffer,0,0x400);
    out_bit_idx = 3;
    is_first_byte = 0;
    while (sVar2 = fread(input_buffer,1,0x400,(FILE *)input_file_ptr), sVar2 != 0) {
      sVar3 = 0;
      while (sVar2 != sVar3) {
        iVar1 = process_symbol(input_buffer[sVar3],output_buffer,output_file_ptr);
        sVar3 = sVar3 + 1;
        if (iVar1 != 0) goto LAB_001019a9;
      }
    }
    iVar1 = flush_data(output_buffer,output_file_ptr);
    if (iVar1 == 0) {
      print_final_stats(input_file_ptr,output_file_ptr);
      fclose((FILE *)output_file_ptr);
      output_file_ptr = bin_open_update(output_file_name);
      if (output_file_ptr == (FILE *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = flush_header(output_file_ptr);
      }
    }
    else {
      iVar1 = 1;
    }
  }
LAB_001019a9:
  adh_release(output_file_ptr,input_file_ptr);
  return iVar1;
}

Assistant:

int adh_compress_file(const char input_file_name[], const char output_file_name[]) {
    log_info("adh_compress_file", "%-40s %s\n", input_file_name, output_file_name);

    FILE *output_file_ptr, *input_file_ptr;
    int rc = adh_init(input_file_name, output_file_name, &output_file_ptr, &input_file_ptr);
    if (rc != RC_OK) goto error_handling;

    byte_t output_buffer[BUFFER_SIZE] = {0};
    byte_t input_buffer[BUFFER_SIZE] = {0};

    // reserve first 3 bits for header
    out_bit_idx = HEADER_BITS;
    is_first_byte = true;

    size_t bytesRead = 0;
    while ((bytesRead = fread(input_buffer, sizeof(byte_t), BUFFER_SIZE, input_file_ptr)) > 0)
    {
        for(int i=0;i<bytesRead;i++) {
            rc = process_symbol(input_buffer[i], output_buffer, output_file_ptr);
            if (rc != RC_OK) goto error_handling;
        }
    }

    // flush remaining data to file
    rc = flush_data(output_buffer, output_file_ptr);
    if (rc != RC_OK) goto error_handling;

    print_final_stats(input_file_ptr, output_file_ptr);

    // close and reopen in update mode
    fclose(output_file_ptr);
    output_file_ptr = bin_open_update(output_file_name);
    if (output_file_ptr == NULL) goto error_handling;

    rc = flush_header(output_file_ptr);

error_handling:
    adh_release(output_file_ptr, input_file_ptr);

    return rc;
}